

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void parse_chunk(LexState *ls)

{
  int iVar1;
  LexState *in_RDI;
  bool bVar2;
  int islast;
  LexState *in_stack_ffffffffffffffe8;
  int local_c;
  
  local_c = 0;
  synlevel_begin((LexState *)0x14889b);
  while( true ) {
    bVar2 = false;
    if (local_c == 0) {
      iVar1 = parse_isend(in_RDI->tok);
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) break;
    local_c = parse_stmt(in_RDI);
    lex_opt(in_stack_ffffffffffffffe8,0);
    in_RDI->fs->freereg = in_RDI->fs->nactvar;
  }
  in_RDI->level = in_RDI->level - 1;
  return;
}

Assistant:

static void parse_chunk(LexState *ls)
{
  int islast = 0;
  synlevel_begin(ls);
  while (!islast && !parse_isend(ls->tok)) {
    islast = parse_stmt(ls);
    lex_opt(ls, ';');
    lj_assertLS(ls->fs->framesize >= ls->fs->freereg &&
		ls->fs->freereg >= ls->fs->nactvar,
		"bad regalloc");
    ls->fs->freereg = ls->fs->nactvar;  /* Free registers after each stmt. */
  }
  synlevel_end(ls);
}